

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O1

int __thiscall MPEG2StreamReader::intDecodeNAL(MPEG2StreamReader *this,uint8_t *buff)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  bVar1 = *buff;
  iVar2 = 0;
  if (bVar1 < 0xb5) {
    if (bVar1 == 0) {
      iVar2 = decodePicture(this,buff);
    }
    else {
      iVar2 = 0;
      if ((bVar1 == 0xb3) && (iVar2 = processSeqStartCode(this,buff), iVar2 == 0)) {
        pbVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
        for (pbVar5 = buff + 2; pbVar5 < pbVar6; pbVar5 = pbVar5 + lVar4) {
          lVar4 = 3;
          if (*pbVar5 < 2) {
            if (*pbVar5 == 0) {
              lVar4 = 1;
            }
            else if ((pbVar5[-2] == 0) && (pbVar5[-1] == 0)) {
              pbVar6 = pbVar5 + -2;
              break;
            }
          }
        }
        iVar2 = -10;
LAB_001bdff5:
        pbVar5 = pbVar6 + 3;
        if (pbVar5 < (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
          bVar1 = pbVar6[3];
          if (bVar1 == 0xb5) {
            iVar3 = processExtStartCode(this,pbVar5);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          else if (bVar1 == 0xb8) {
            *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
          }
          else if (bVar1 == 0) {
            iVar2 = decodePicture(this,pbVar5);
            if (iVar2 != 0) {
              return iVar2;
            }
            (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar5;
            return 0;
          }
          pbVar5 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
          for (pbVar7 = pbVar6 + 5; pbVar6 = pbVar5, pbVar7 < pbVar5; pbVar7 = pbVar7 + lVar4) {
            lVar4 = 3;
            if (*pbVar7 < 2) {
              if (*pbVar7 == 0) {
                lVar4 = 1;
              }
              else if ((pbVar7[-2] == 0) && (pbVar7[-1] == 0)) {
                pbVar6 = pbVar7 + -2;
                break;
              }
            }
          }
          goto LAB_001bdff5;
        }
      }
    }
  }
  else if (bVar1 == 0xb5) {
    iVar2 = processExtStartCode(this,buff);
  }
  else if (bVar1 == 0xb8) {
    *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
  }
  return iVar2;
}

Assistant:

int MPEG2StreamReader::intDecodeNAL(uint8_t* buff)
{
    try
    {
        int rez;
        uint8_t* nextNal;
        switch (*buff)
        {
        case SEQ_START_SHORT_CODE:
            rez = processSeqStartCode(buff);
            if (rez != 0)
                return rez;
            nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd) + 3;
            while (true)
            {
                if (nextNal >= m_bufEnd)
                    return NOT_ENOUGH_BUFFER;
                switch (*nextNal)
                {
                case EXT_START_SHORT_CODE:
                    rez = processExtStartCode(nextNal);
                    if (rez != 0)
                        return rez;
                    break;
                case GOP_START_SHORT_CODE:
                    m_framesAtGop = -1;
                    m_lastRef = -1;
                    break;
                case PICTURE_START_SHORT_CODE:
                    rez = decodePicture(nextNal);
                    if (rez == 0)
                    {
                        m_lastDecodedPos = nextNal;
                    }
                    return rez;
                default:;
                }
                nextNal = MPEGHeader::findNextMarker(nextNal, m_bufEnd) + 3;
            }
        case EXT_START_SHORT_CODE:
            return processExtStartCode(buff);
        case GOP_START_SHORT_CODE:
            m_framesAtGop = -1;
            m_lastRef = -1;
            break;
        case PICTURE_START_SHORT_CODE:
            rez = decodePicture(buff);
            return rez;
        default:;
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}